

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

Symbol * __thiscall slang::ast::Compilation::getDefaultClocking(Compilation *this,Scope *scope)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  Symbol *pSVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  value_type *elements;
  ulong uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  undefined1 auVar18 [16];
  
  pSVar8 = Scope::getContainingInstanceOrChecker(scope);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = pSVar8;
  uVar11 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar9 = uVar11 >> ((byte)(this->defaultClockingMap).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
                           .arrays.groups_size_index & 0x3f);
  pgVar3 = (this->defaultClockingMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
           .arrays.groups_;
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar11 & 0xff];
  ppVar4 = (this->defaultClockingMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
           .arrays.elements_;
  uVar5 = (this->defaultClockingMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
          .arrays.groups_size_mask;
  uVar13 = 0;
  do {
    pgVar1 = pgVar3 + uVar9;
    uVar14 = (uchar)uVar2;
    auVar18[0] = -(pgVar1->m[0].n == uVar14);
    uVar15 = (uchar)((uint)uVar2 >> 8);
    auVar18[1] = -(pgVar1->m[1].n == uVar15);
    uVar16 = (uchar)((uint)uVar2 >> 0x10);
    auVar18[2] = -(pgVar1->m[2].n == uVar16);
    uVar17 = (uchar)((uint)uVar2 >> 0x18);
    auVar18[3] = -(pgVar1->m[3].n == uVar17);
    auVar18[4] = -(pgVar1->m[4].n == uVar14);
    auVar18[5] = -(pgVar1->m[5].n == uVar15);
    auVar18[6] = -(pgVar1->m[6].n == uVar16);
    auVar18[7] = -(pgVar1->m[7].n == uVar17);
    auVar18[8] = -(pgVar1->m[8].n == uVar14);
    auVar18[9] = -(pgVar1->m[9].n == uVar15);
    auVar18[10] = -(pgVar1->m[10].n == uVar16);
    auVar18[0xb] = -(pgVar1->m[0xb].n == uVar17);
    auVar18[0xc] = -(pgVar1->m[0xc].n == uVar14);
    auVar18[0xd] = -(pgVar1->m[0xd].n == uVar15);
    auVar18[0xe] = -(pgVar1->m[0xe].n == uVar16);
    auVar18[0xf] = -(pgVar1->m[0xf].n == uVar17);
    for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
        uVar12 = uVar12 - 1 & uVar12) {
      iVar6 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (pSVar8 == *(Symbol **)((long)&ppVar4[uVar9 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
        lVar10 = (long)&ppVar4[uVar9 * 0xf].first + (ulong)(uint)(iVar6 << 4);
        goto LAB_0014499a;
      }
    }
    if ((pgVar3[uVar9].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7]) == 0) break;
    lVar10 = uVar9 + uVar13;
    uVar13 = uVar13 + 1;
    uVar9 = lVar10 + 1U & uVar5;
  } while (uVar13 <= uVar5);
  lVar10 = 0;
LAB_0014499a:
  if (lVar10 == 0) {
    if (((pSVar8 == (Symbol *)0x0) || (pSVar8->kind != CheckerInstanceBody)) ||
       (pSVar8->parentScope == (Scope *)0x0)) {
      pSVar8 = (Symbol *)0x0;
    }
    else {
      pSVar8 = getDefaultClocking(this,pSVar8->parentScope);
    }
  }
  else {
    pSVar8 = *(Symbol **)(lVar10 + 8);
  }
  return pSVar8;
}

Assistant:

const Symbol* Compilation::getDefaultClocking(const Scope& scope) const {
    auto lookupSym = scope.getContainingInstanceOrChecker();
    if (auto it = defaultClockingMap.find(lookupSym); it != defaultClockingMap.end())
        return it->second;

    // If we're in a checker we can inherit from the containing instance.
    if (lookupSym && lookupSym->kind == SymbolKind::CheckerInstanceBody) {
        if (auto parent = lookupSym->getParentScope())
            return getDefaultClocking(*parent);
    }

    return nullptr;
}